

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

void SzArEx_Free(CSzArEx *p,ISzAlloc *alloc)

{
  CSzAr *in_RSI;
  long in_RDI;
  ISzAlloc *in_stack_ffffffffffffffe8;
  
  (*(code *)in_RSI->PackPositions)(in_RSI,*(undefined8 *)(in_RDI + 0x68));
  (*(code *)in_RSI->PackPositions)(in_RSI,*(undefined8 *)(in_RDI + 0x70));
  (*(code *)in_RSI->PackPositions)(in_RSI,*(undefined8 *)(in_RDI + 0xb8));
  (*(code *)in_RSI->PackPositions)(in_RSI,*(undefined8 *)(in_RDI + 0xc0));
  (*(code *)in_RSI->PackPositions)(in_RSI,*(undefined8 *)(in_RDI + 200));
  (*(code *)in_RSI->PackPositions)(in_RSI,*(undefined8 *)(in_RDI + 0xd0));
  SzBitUi32s_Free((CSzBitUi32s *)in_RSI,in_stack_ffffffffffffffe8);
  SzBitUi32s_Free((CSzBitUi32s *)in_RSI,in_stack_ffffffffffffffe8);
  SzBitUi64s_Free((CSzBitUi64s *)in_RSI,in_stack_ffffffffffffffe8);
  SzBitUi64s_Free((CSzBitUi64s *)in_RSI,in_stack_ffffffffffffffe8);
  SzAr_Free(in_RSI,in_stack_ffffffffffffffe8);
  SzArEx_Init((CSzArEx *)0x9e84ee);
  return;
}

Assistant:

void SzArEx_Free(CSzArEx *p, ISzAlloc *alloc)
{
  IAlloc_Free(alloc, p->UnpackPositions);
  IAlloc_Free(alloc, p->IsDirs);

  IAlloc_Free(alloc, p->FolderToFile);
  IAlloc_Free(alloc, p->FileToFolder);

  IAlloc_Free(alloc, p->FileNameOffsets);
  IAlloc_Free(alloc, p->FileNames);

  SzBitUi32s_Free(&p->CRCs, alloc);
  SzBitUi32s_Free(&p->Attribs, alloc);
  // SzBitUi32s_Free(&p->Parents, alloc);
  SzBitUi64s_Free(&p->MTime, alloc);
  SzBitUi64s_Free(&p->CTime, alloc);
  
  SzAr_Free(&p->db, alloc);
  SzArEx_Init(p);
}